

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ApplySizeFullWithConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiSizeConstraintCallbackData data;
  ImGuiSizeConstraintCallbackData local_38;
  
  pIVar1 = GImGui;
  if (GImGui->SetNextWindowSizeConstraint == true) {
    fVar6 = (GImGui->SetNextWindowSizeConstraintRect).Min.x;
    fVar3 = (GImGui->SetNextWindowSizeConstraintRect).Min.y;
    fVar5 = new_size.x;
    fVar4 = new_size.y;
    if ((fVar6 < 0.0) || (fVar7 = (GImGui->SetNextWindowSizeConstraintRect).Max.x, fVar7 < 0.0)) {
      fVar6 = (window->SizeFull).x;
    }
    else {
      if (fVar5 <= fVar7) {
        fVar7 = fVar5;
      }
      fVar6 = (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 | ~-(uint)(fVar5 < fVar6) & (uint)fVar7);
    }
    if ((fVar3 < 0.0) || (fVar5 = (GImGui->SetNextWindowSizeConstraintRect).Max.y, fVar5 < 0.0)) {
      fVar3 = (window->SizeFull).y;
    }
    else {
      if (fVar4 <= fVar5) {
        fVar5 = fVar4;
      }
      fVar3 = (float)(-(uint)(fVar4 < fVar3) & (uint)fVar3 | ~-(uint)(fVar4 < fVar3) & (uint)fVar5);
    }
    new_size.y = fVar3;
    new_size.x = fVar6;
    if (GImGui->SetNextWindowSizeConstraintCallback != (ImGuiSizeConstraintCallback)0x0) {
      local_38.UserData = GImGui->SetNextWindowSizeConstraintCallbackUserData;
      local_38.Pos = window->Pos;
      local_38.CurrentSize = window->SizeFull;
      local_38.DesiredSize = new_size;
      (*GImGui->SetNextWindowSizeConstraintCallback)(&local_38);
      new_size = local_38.DesiredSize;
    }
  }
  if ((window->Flags & 0x100040U) == 0) {
    fVar6 = (pIVar1->Style).WindowMinSize.x;
    fVar3 = (pIVar1->Style).WindowMinSize.y;
    uVar2 = -(uint)(fVar6 <= new_size.x);
    fVar5 = new_size.y;
    new_size.x = (float)(~uVar2 & (uint)fVar6 | uVar2 & (uint)new_size.x);
    uVar2 = -(uint)(fVar3 <= fVar5);
    new_size.y = (float)(~uVar2 & (uint)fVar3 | (uint)fVar5 & uVar2);
  }
  window->SizeFull = new_size;
  return;
}

Assistant:

static void ApplySizeFullWithConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.SetNextWindowSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.SetNextWindowSizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.SetNextWindowSizeConstraintCallback)
        {
            ImGuiSizeConstraintCallbackData data;
            data.UserData = g.SetNextWindowSizeConstraintCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.SetNextWindowSizeConstraintCallback(&data);
            new_size = data.DesiredSize;
        }
    }
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
        new_size = ImMax(new_size, g.Style.WindowMinSize);
    window->SizeFull = new_size;
}